

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void kill_monster_on_level(int mndx)

{
  monst *pmVar1;
  int iVar2;
  monst *mtmp2;
  monst *mtmp;
  int mndx_local;
  
  pmVar1 = level->monlist;
  while (mtmp2 = pmVar1, mtmp2 != (monst *)0x0) {
    pmVar1 = mtmp2->nmon;
    if (0 < mtmp2->mhp) {
      if (mtmp2->mnum == mndx) {
        mondead(mtmp2);
      }
      else if (((*(uint *)&mtmp2->field_0x60 >> 4 & 7) != 0) &&
              (iVar2 = monsndx(mtmp2->data), iVar2 == mndx)) {
        newcham(level,mtmp2,(permonst *)0x0,'\0','\0');
      }
    }
  }
  return;
}

Assistant:

void kill_monster_on_level(int mndx)
{
	struct monst *mtmp;
	struct monst *mtmp2;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
	    mtmp2 = mtmp->nmon;
	    if (DEADMONSTER(mtmp)) continue;
	    /*
	     * Level genociding a chameleon kills it,
	     * while level genociding its form just makes it change form.
	     */
	    if (mtmp->mnum == mndx)
		mondead(mtmp);
	    else if (mtmp->cham && monsndx(mtmp->data) == mndx)
		newcham(level, mtmp, NULL, FALSE, FALSE);
	}
}